

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.cpp
# Opt level: O2

czstring pstore::http::opcode_name(opcode op)

{
  if (op < 0x10) {
    return &DAT_001262ac + *(int *)(&DAT_001262ac + (ulong)op * 4);
  }
  return "unknown";
}

Assistant:

auto opcode_name (opcode const op) noexcept -> gsl::czstring {
            switch (op) {
            case opcode::continuation: return "continuation";
            case opcode::text: return "text";
            case opcode::binary: return "binary";
            case opcode::reserved_nc_1: return "reserved_nc_1";
            case opcode::reserved_nc_2: return "reserved_nc_2";
            case opcode::reserved_nc_3: return "reserved_nc_3";
            case opcode::reserved_nc_4: return "reserved_nc_4";
            case opcode::reserved_nc_5: return "reserved_nc_5";
            case opcode::close: return "close";
            case opcode::ping: return "ping";
            case opcode::pong: return "pong";
            case opcode::reserved_control_1: return "reserved_control_1";
            case opcode::reserved_control_2: return "reserved_control_2";
            case opcode::reserved_control_3: return "reserved_control_3";
            case opcode::reserved_control_4: return "reserved_control_4";
            case opcode::reserved_control_5: return "reserved_control_5";
            case opcode::unknown: break;
            }
            return "unknown";
        }